

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# boxed_number.hpp
# Opt level: O2

Boxed_Value __thiscall
chaiscript::Boxed_Number::binary_go<signed_char,long>
          (Boxed_Number *this,Opers t_oper,char *t,long *u,Boxed_Value *t_lhs)

{
  char cVar1;
  bad_any_cast *this_00;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  Boxed_Value BVar2;
  
  switch(t_oper) {
  case assign:
    cVar1 = (char)*u;
    break;
  default:
    this_00 = (bad_any_cast *)__cxa_allocate_exception(0x28);
    detail::exception::bad_any_cast::bad_any_cast(this_00);
    __cxa_throw(this_00,&detail::exception::bad_any_cast::typeinfo,
                detail::exception::bad_any_cast::~bad_any_cast);
  case assign_product:
    cVar1 = *t * (char)*u;
    break;
  case assign_sum:
    cVar1 = *t + (char)*u;
    break;
  case assign_quotient:
    check_divide_by_zero<long>(*u,(type *)0x0);
    cVar1 = (char)((long)*t / *u);
    break;
  case assign_difference:
    cVar1 = *t - (char)*u;
  }
  *t = cVar1;
  std::__shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            ((__shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2> *)this,
             (__shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2> *)t_lhs);
  BVar2.m_data.super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = extraout_RDX._M_pi;
  BVar2.m_data.super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>._M_ptr
       = (element_type *)this;
  return (Boxed_Value)
         BVar2.m_data.super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

static Boxed_Value binary_go(Operators::Opers t_oper, T &t, const U &u, const Boxed_Value &t_lhs) 
      {
        switch (t_oper)
        {
          case Operators::assign:
            t = u;
            break;
          case Operators::assign_product:
            t *= u;
            break;
          case Operators::assign_sum:
            t += u;
            break;
          case Operators::assign_quotient:
            check_divide_by_zero(u);
            t /= u;
            break;
          case Operators::assign_difference:
            t -= u;
            break;
          default:
            throw chaiscript::detail::exception::bad_any_cast();
        }

        return t_lhs;
      }